

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry_&> __thiscall
kj::
Table<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry,kj::HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>>
::find<0ul,capnp::Type&>
          (Table<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry,kj::HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>>
           *this,Type *params)

{
  Maybe<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry_&> MVar1;
  ArrayPtr<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> table;
  HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks> local_20 [8];
  long local_18;
  
  table.size_ = *(size_t *)this;
  table.ptr = (Entry *)(this + 0x20);
  HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>::
  find<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry,capnp::Type&>
            (local_20,table,(Type *)((long)(*(long *)(this + 8) - *(size_t *)this) / 0x18));
  MVar1.ptr = (Entry *)0x0;
  if (local_20[0] !=
      (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)0x0) {
    MVar1.ptr = (Entry *)(local_18 * 0x18 + *(long *)this);
  }
  return (Maybe<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry_&>)MVar1.ptr;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_MAYBE(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[*pos];
  } else {
    return nullptr;
  }
}